

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.h
# Opt level: O2

void __thiscall trun::TestResponseProxy::~TestResponseProxy(TestResponseProxy *this)

{
  this->_vptr_TestResponseProxy = (_func_int **)&PTR__TestResponseProxy_0011cc38;
  std::__cxx11::string::~string((string *)&this->moduleName);
  std::__cxx11::string::~string((string *)&this->symbolName);
  std::__cxx11::string::~string((string *)&this->exceptionString);
  trun::AssertError::~AssertError(&this->assertError);
  return;
}

Assistant:

virtual ~TestResponseProxy() = default;